

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

Int __thiscall
ipx::BasicLu::_Factorize
          (BasicLu *this,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,bool strict_abs_pivottol)

{
  reference pvVar1;
  int *d;
  logic_error *this_00;
  ostream *poVar2;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  byte in_R9B;
  Int ret;
  double *in_stack_00000128;
  lu_int *in_stack_00000130;
  double stability;
  double normUinv;
  double normLinv;
  lu_int *in_stack_00000150;
  Int dim;
  Int unz;
  Int lnz;
  Int matrix_nz;
  lu_int *in_stack_00000170;
  Int ncall;
  Int status;
  BasicLu *in_stack_fffffffffffffe80;
  uint local_f4;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  value_type local_90;
  value_type local_88;
  value_type local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_54;
  lu_int local_50;
  byte local_49;
  
  local_49 = in_R9B & 1;
  if (local_49 == 0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0xd);
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),5);
    *pvVar1 = 1e-14;
  }
  else {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),0xd);
    *pvVar1 = 1.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),5);
    *pvVar1 = 0.001;
  }
  local_54 = 0;
  while( true ) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8085ed);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x808606);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80861f);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x80863b);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x808654);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x808670);
    d = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x808689);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x8086a0);
    local_50 = basiclu_factorize(in_stack_00000150,(double *)normLinv,(lu_int *)normUinv,
                                 (double *)stability,in_stack_00000130,in_stack_00000128,
                                 in_stack_00000170,(double *)CONCAT17(strict_abs_pivottol,_status),
                                 (lu_int *)Bx,Bi,Bend,(double *)Bbegin,(lu_int)this);
    if (local_50 != 1) break;
    Reallocate(in_stack_fffffffffffffe80);
    local_54 = local_54 + 1;
  }
  if ((local_50 != 0) && (local_50 != 2)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_factorize failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x30);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,100);
  local_68 = (int)*pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x4c);
  local_6c = (int)*pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x4d);
  local_70 = (int)*pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x40);
  local_74 = (int)*pvVar1;
  *(double *)(in_RDI + 0xd8) = (double)(local_6c + local_70 + local_74) / (double)local_68;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x60);
  local_80 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x61);
  local_88 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0x6f);
  local_90 = *pvVar1;
  poVar2 = Control::Debug(*(Control **)(in_RDI + 0x10),3);
  poVar2 = std::operator<<(poVar2," normLinv = ");
  sci2_abi_cxx11_((double)d);
  poVar2 = std::operator<<(poVar2,local_b0);
  poVar2 = std::operator<<(poVar2,',');
  poVar2 = std::operator<<(poVar2," normUinv = ");
  sci2_abi_cxx11_((double)d);
  poVar2 = std::operator<<(poVar2,local_d0);
  poVar2 = std::operator<<(poVar2,',');
  poVar2 = std::operator<<(poVar2," stability = ");
  sci2_abi_cxx11_((double)d);
  poVar2 = std::operator<<(poVar2,local_f0);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  local_f4 = (uint)(1e-12 < local_90);
  if (local_50 == 2) {
    local_f4 = local_f4 | 2;
  }
  return local_f4;
}

Assistant:

Int BasicLu::_Factorize(const Int* Bbegin, const Int* Bend, const Int* Bi,
                        const double* Bx, bool strict_abs_pivottol) {
    Int status;
    if (strict_abs_pivottol) {
        xstore_[BASICLU_REMOVE_COLUMNS] = 1;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = kLuDependencyTol;
    } else {
        xstore_[BASICLU_REMOVE_COLUMNS] = 0;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = 1e-14; // BASICLU default
    }
    for (Int ncall = 0; ; ncall++) {
        status = basiclu_factorize(istore_.data(), xstore_.data(),
                                   Li_.data(), Lx_.data(),
                                   Ui_.data(), Ux_.data(),
                                   Wi_.data(), Wx_.data(),
                                   Bbegin, Bend, Bi, Bx, ncall);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status != BASICLU_WARNING_singular_matrix)
        throw std::logic_error("basiclu_factorize failed");

    Int matrix_nz = xstore_[BASICLU_MATRIX_NZ];
    Int lnz = xstore_[BASICLU_LNZ];
    Int unz = xstore_[BASICLU_UNZ];
    Int dim = xstore_[BASICLU_DIM];
    fill_factor_ = 1.0 * (lnz+unz+dim) / matrix_nz;

    double normLinv = xstore_[BASICLU_NORMEST_LINV];
    double normUinv = xstore_[BASICLU_NORMEST_UINV];
    double stability = xstore_[BASICLU_RESIDUAL_TEST];
    control_.Debug(3)
        << " normLinv = " << sci2(normLinv) << ','
        << " normUinv = " << sci2(normUinv) << ','
        << " stability = " << sci2(stability) << '\n';

    Int ret = 0;
    if (stability > kLuStabilityThreshold)
        ret |= 1;
    if (status == BASICLU_WARNING_singular_matrix)
        ret |= 2;
    return ret;
}